

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O0

TPZCompEl * __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePrism>_>::Clone
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePrism>_> *this,TPZCompMesh *mesh)

{
  TPZCompEl *pTVar1;
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePrism>_> *in_RSI;
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePrism>_> *in_stack_ffffffffffffffe0;
  TPZCompMesh *in_stack_ffffffffffffffe8;
  
  pTVar1 = (TPZCompEl *)operator_new(0x148);
  TPZCompElPostProc(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  return pTVar1;
}

Assistant:

inline TPZCompEl * TPZCompElPostProc<TCOMPEL>::Clone(TPZCompMesh &mesh) const{
    return new TPZCompElPostProc<TCOMPEL> (mesh, *this);
}